

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon.c
# Opt level: O1

void mon_to_stone(monst *mtmp)

{
  uint uVar1;
  boolean bVar2;
  int iVar3;
  char *pcVar4;
  
  if (mtmp->data->mlet != '7') {
    pcVar4 = a_monnam(mtmp);
    impossible("Can\'t polystone %s!",pcVar4);
    return;
  }
  if (mtmp->wormno == '\0') {
    if (((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) &&
       ((((u.uprops[0x1e].intrinsic != 0 ||
          (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
           (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
         ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) ||
        (((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0 &&
          (((youmonst.data)->mflags3 & 0x100) == 0)) ||
         (((viz_array[mtmp->my][mtmp->mx] & 1U) == 0 || ((mtmp->data->mflags3 & 0x200) == 0))))))))
    goto LAB_001e5dd3;
  }
  else {
    bVar2 = worm_known(level,mtmp);
    if (bVar2 == '\0') goto LAB_001e5dd3;
  }
  uVar1 = *(uint *)&mtmp->field_0x60;
  if ((((uVar1 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)) {
    if ((uVar1 & 0x280) != 0) goto LAB_001e5dd3;
  }
  else if (((uVar1 & 0x280) != 0) || (((youmonst.data)->mflags1 & 0x1000000) == 0))
  goto LAB_001e5dd3;
  if ((u._1052_1_ & 0x20) == 0) {
    pcVar4 = Monnam(mtmp);
    pline("%s solidifies...",pcVar4);
  }
LAB_001e5dd3:
  iVar3 = newcham(level,mtmp,mons + 0x108,'\0','\0');
  if (iVar3 == 0) {
    if (mtmp->wormno == '\0') {
      if ((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) {
        if (((u.uprops[0x1e].intrinsic != 0) || ((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)))
            ) || (((youmonst.data)->mflags1 & 0x1000) != 0)) {
          if (ublindf == (obj *)0x0) {
            return;
          }
          if (ublindf->oartifact != '\x1d') {
            return;
          }
        }
        if ((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
           (((youmonst.data)->mflags3 & 0x100) == 0)) {
          return;
        }
        if ((viz_array[mtmp->my][mtmp->mx] & 1U) == 0) {
          return;
        }
        if ((mtmp->data->mflags3 & 0x200) == 0) {
          return;
        }
      }
    }
    else {
      bVar2 = worm_known(level,mtmp);
      if (bVar2 == '\0') {
        return;
      }
    }
    uVar1 = *(uint *)&mtmp->field_0x60;
    if ((((uVar1 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)) {
      if ((uVar1 & 0x280) != 0) {
        return;
      }
    }
    else {
      if ((uVar1 & 0x280) != 0) {
        return;
      }
      if (((youmonst.data)->mflags1 & 0x1000000) == 0) {
        return;
      }
    }
    if ((u._1052_1_ & 0x20) == 0) {
      pline("... and returns to normal.");
      return;
    }
  }
  else {
    if (mtmp->wormno == '\0') {
      if ((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) {
        if (((u.uprops[0x1e].intrinsic != 0) || ((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)))
            ) || (((youmonst.data)->mflags1 & 0x1000) != 0)) {
          if (ublindf == (obj *)0x0) {
            return;
          }
          if (ublindf->oartifact != '\x1d') {
            return;
          }
        }
        if ((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
           (((youmonst.data)->mflags3 & 0x100) == 0)) {
          return;
        }
        if ((viz_array[mtmp->my][mtmp->mx] & 1U) == 0) {
          return;
        }
        if ((mtmp->data->mflags3 & 0x200) == 0) {
          return;
        }
      }
    }
    else {
      bVar2 = worm_known(level,mtmp);
      if (bVar2 == '\0') {
        return;
      }
    }
    uVar1 = *(uint *)&mtmp->field_0x60;
    if ((((uVar1 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)) {
      if ((uVar1 & 0x280) != 0) {
        return;
      }
    }
    else {
      if ((uVar1 & 0x280) != 0) {
        return;
      }
      if (((youmonst.data)->mflags1 & 0x1000000) == 0) {
        return;
      }
    }
    if ((u._1052_1_ & 0x20) == 0) {
      pcVar4 = mons_mname(mtmp->data);
      pcVar4 = an(pcVar4);
      pline("Now it\'s %s.",pcVar4);
      return;
    }
  }
  return;
}

Assistant:

void mon_to_stone(struct monst *mtmp)
{
    if (mtmp->data->mlet == S_GOLEM) {
	/* it's a golem, and not a stone golem */
	if (canseemon(level, mtmp))
	    pline("%s solidifies...", Monnam(mtmp));
	if (newcham(level, mtmp, &mons[PM_STONE_GOLEM], FALSE, FALSE)) {
	    if (canseemon(level, mtmp))
		pline("Now it's %s.", an(mons_mname(mtmp->data)));
	} else {
	    if (canseemon(level, mtmp))
		pline("... and returns to normal.");
	}
    } else
	impossible("Can't polystone %s!", a_monnam(mtmp));
}